

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COpenGLCoreCacheHandler.h
# Opt level: O2

void __thiscall
irr::video::
COpenGLCoreCacheHandler<irr::video::COpenGL3DriverBase,_irr::video::COpenGLCoreTexture<irr::video::COpenGL3DriverBase>_>
::setBlendEquation(COpenGLCoreCacheHandler<irr::video::COpenGL3DriverBase,_irr::video::COpenGLCoreTexture<irr::video::COpenGL3DriverBase>_>
                   *this,GLenum mode)

{
  GLenum *pGVar1;
  GLuint i;
  ulong uVar2;
  
  if ((*this->BlendEquation != mode) || (this->BlendEquationInvalid == true)) {
    (*GL.BlendEquation)(mode);
    pGVar1 = this->BlendEquation;
    for (uVar2 = 0; uVar2 < this->FrameBufferCount; uVar2 = uVar2 + 1) {
      pGVar1[uVar2] = mode;
    }
    this->BlendEquationInvalid = false;
  }
  return;
}

Assistant:

void setBlendEquation(GLenum mode)
	{
		if (BlendEquation[0] != mode || BlendEquationInvalid) {
			Driver->irrGlBlendEquation(mode);

			for (GLuint i = 0; i < FrameBufferCount; ++i)
				BlendEquation[i] = mode;

			BlendEquationInvalid = false;
		}
	}